

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O2

void Assimp::IFC::ProcessSweptDiskSolid
               (IfcSweptDiskSolid *solid,TempMesh *result,ConversionData *conv)

{
  pointer paVar1;
  double dVar2;
  TempMesh *this;
  IfcCurve *curve;
  Curve *pCVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint seg;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  float fVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  aiVector3t<float> aVar35;
  aiVector3t<float> aVar36;
  char *unaff_retaddr;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> points;
  float local_1a8;
  float fStack_1a4;
  undefined8 local_198;
  undefined1 local_178 [16];
  double local_168;
  float local_158;
  undefined4 uStack_154;
  double dStack_150;
  aiVector3t<double> local_148;
  double local_128;
  IfcSweptDiskSolid *local_120;
  TempMesh *local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_110;
  TempMesh temp;
  undefined1 local_d8 [16];
  double local_c8;
  IfcMatrix4 rot;
  
  curve = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::operator*
                    ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)
                     &(solid->super_IfcSolidModel).field_0x40);
  pCVar3 = Curve::Convert(curve,conv);
  if (pCVar3 == (Curve *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  uVar11 = conv->settings->cylindricalTessellation;
  uVar12 = (ulong)uVar11;
  temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*pCVar3->_vptr_Curve[7])(SUB84(solid->StartParam,0),SUB84(solid->EndParam,0),pCVar3);
  lVar4 = ((long)temp.mVerts.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)temp.mVerts.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start) / 0x18;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&result->mVerts,lVar4 * uVar12 * 4);
  local_110 = &result->mVertcnt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_110,(ulong)(uVar11 - 1) * lVar4);
  points.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  points.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  points.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&points,lVar4 * uVar12);
  if (temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      temp.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4f993a);
  }
  else {
    local_128 = 6.283185307179586 / (double)uVar12;
    uVar20 = *(undefined4 *)
              ((long)&(temp.mVerts.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x + 4);
    uVar22 = *(undefined4 *)
              ((long)&(temp.mVerts.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y + 4);
    local_200 = (temp.mVerts.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->z;
    uVar16 = SUB84(local_200,0);
    uVar17 = (undefined4)((ulong)local_200 >> 0x20);
    dVar26 = 0.0;
    local_1e8 = 1.0;
    local_1f8 = 1.0;
    local_1f0 = 1.0;
    iVar6 = 0;
    dVar28 = 0.0;
    fVar18 = *(float *)&(temp.mVerts.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x;
    uVar21 = *(undefined4 *)
              &(temp.mVerts.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start)->y;
    fVar19 = *(float *)&(temp.mVerts.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x;
    uVar23 = uVar20;
    uVar24 = *(undefined4 *)
              &(temp.mVerts.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start)->y;
    uVar25 = uVar22;
    dVar30 = 0.0;
    local_120 = solid;
    local_118 = result;
    for (lVar13 = 0; local_198 = (double)CONCAT44(uVar23,fVar19), lVar13 != lVar4;
        lVar13 = lVar13 + 1) {
      if (lVar13 != lVar4 + -1) {
        dVar28 = temp.mVerts.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar13 + 1].x;
        dVar30 = temp.mVerts.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar13 + 1].y;
        dVar26 = temp.mVerts.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar13 + 1].z;
      }
      local_168 = (dVar26 - (double)CONCAT44(uVar17,uVar16)) +
                  (local_200 - (double)CONCAT44(uVar17,uVar16));
      local_158 = SUB84(dVar28,0);
      uStack_154 = (undefined4)((ulong)dVar28 >> 0x20);
      dVar2 = (dVar30 - (double)CONCAT44(uVar22,uVar21)) +
              ((double)CONCAT44(uVar25,uVar24) - (double)CONCAT44(uVar22,uVar21));
      local_178._8_4_ = SUB84(dVar2,0);
      local_178._0_8_ =
           (dVar28 - (double)CONCAT44(uVar20,fVar18)) +
           (local_198 - (double)CONCAT44(uVar20,fVar18));
      local_178._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dStack_150 = dVar30;
      aiVector3t<double>::Normalize((aiVector3t<double> *)local_178);
      if ((iVar6 != 0) || (ABS((double)local_178._0_8_) <= 1e-06)) {
        if ((iVar6 != 1) || (ABS((double)local_178._8_8_) <= 1e-06)) {
          if ((iVar6 != 2) || (ABS(local_168) <= 1e-06)) {
            if (1e-06 < ABS((double)local_178._0_8_)) goto LAB_004f93a3;
            if (1e-06 < ABS((double)local_178._8_8_)) goto LAB_004f93ed;
          }
          local_1f8 = -((double)local_178._8_8_ * local_1e8 + (double)local_178._0_8_ * local_1f0) /
                      local_168;
          iVar6 = 2;
        }
        else {
LAB_004f93ed:
          local_1e8 = -((double)local_178._0_8_ * local_1f0 + local_168 * local_1f8) /
                      (double)local_178._8_8_;
          iVar6 = 1;
        }
      }
      else {
LAB_004f93a3:
        local_1f0 = -((double)local_178._8_8_ * local_1e8 + local_168 * local_1f8) /
                    (double)local_178._0_8_;
        iVar6 = 0;
      }
      dVar28 = local_120->Radius /
               SQRT(local_1f8 * local_1f8 + local_1f0 * local_1f0 + local_1e8 * local_1e8);
      local_1f0 = local_1f0 * dVar28;
      local_1e8 = local_1e8 * dVar28;
      local_1f8 = dVar28 * local_1f8;
      rot.a1 = 1.0;
      rot.a4 = 0.0;
      rot.b1 = 0.0;
      rot.a2 = 0.0;
      rot.a3 = 0.0;
      rot.b2 = 1.0;
      rot.c1 = 0.0;
      rot.c2 = 0.0;
      rot.b3 = 0.0;
      rot.b4 = 0.0;
      rot.c3 = 1.0;
      rot.d2 = 0.0;
      rot.d3 = 0.0;
      rot.c4 = 0.0;
      rot.d1 = 0.0;
      rot.d4 = 1.0;
      local_148.x = local_1f0;
      local_148.y = local_1e8;
      local_148.z = local_1f8;
      aiMatrix4x4t<double>::Rotation(local_128,(aiVector3t<double> *)local_178,&rot);
      uVar9 = uVar12;
      while (iVar10 = (int)uVar9, uVar9 = (ulong)(iVar10 - 1), iVar10 != 0) {
        local_c8 = local_148.z + local_200;
        dVar28 = local_148.y + (double)CONCAT44(uVar25,uVar24);
        local_d8._8_4_ = SUB84(dVar28,0);
        local_d8._0_8_ = local_148.x + local_198;
        local_d8._12_4_ = (int)((ulong)dVar28 >> 0x20);
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        emplace_back<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&points,
                   (aiVector3t<double> *)local_d8);
        aiVector3t<double>::operator*=(&local_148,&rot);
      }
      uVar16 = SUB84(local_200,0);
      uVar17 = (undefined4)((ulong)local_200 >> 0x20);
      dVar28 = (double)CONCAT44(uStack_154,local_158);
      fVar18 = fVar19;
      uVar20 = uVar23;
      uVar21 = uVar24;
      uVar22 = uVar25;
      fVar19 = local_158;
      uVar23 = uStack_154;
      uVar24 = SUB84(dStack_150,0);
      uVar25 = (int)((ulong)dStack_150 >> 0x20);
      dVar30 = dStack_150;
      local_200 = dVar26;
    }
    lVar5 = uVar12 * 0x18;
    local_1f8 = 0.0;
    lVar13 = 0;
    lVar8 = lVar5;
    while (lVar13 != lVar4 + -1) {
      aVar35 = aiVector3t::operator_cast_to_aiVector3t
                         (points.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar13 * uVar12);
      local_158 = aVar35.z;
      lVar14 = (lVar13 + 1) * uVar12;
      fVar18 = 1e+10;
      uVar9 = 0;
      lVar7 = lVar8;
      for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
        aVar36 = aiVector3t::operator_cast_to_aiVector3t
                           ((aiVector3t<double> *)
                            ((long)&(points.
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->x + lVar7));
        local_1a8 = aVar35.x;
        fStack_1a4 = aVar35.y;
        local_1a8 = aVar36.x - local_1a8;
        fStack_1a4 = aVar36.y - fStack_1a4;
        fVar19 = aVar36.z - local_158;
        fVar19 = fVar19 * fVar19 + local_1a8 * local_1a8 + fStack_1a4 * fStack_1a4;
        if (fVar19 < fVar18) {
          uVar9 = uVar15 & 0xffffffff;
          fVar18 = fVar19;
        }
        lVar7 = lVar7 + 0x18;
      }
      dVar26 = local_1f8;
      for (uVar15 = 1; this = local_118, uVar15 - uVar12 != 1; uVar15 = uVar15 + 1) {
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&local_118->mVerts,
                   (value_type *)
                   ((long)&(points.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x + (long)dVar26));
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&this->mVerts,
                   points.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   lVar13 * uVar12 + (uVar15 & 0xffffffff) % uVar12);
        uVar11 = (int)uVar9 + 1;
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&this->mVerts,
                   points.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar14 + (ulong)uVar11 % uVar12);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  (&this->mVerts,
                   points.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar14 + uVar9 % uVar12);
        paVar1 = (this->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        dVar28 = paVar1[-4].x;
        dVar31 = dVar28 - paVar1[-3].x;
        dVar30 = paVar1[-4].y;
        dVar32 = dVar30 - paVar1[-3].y;
        dVar2 = paVar1[-4].z;
        dVar29 = dVar2 - paVar1[-3].z;
        dVar33 = dVar28 - paVar1[-1].x;
        dVar27 = dVar30 - paVar1[-1].y;
        dVar34 = dVar2 - paVar1[-1].z;
        if ((dVar2 - temp.mVerts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar13].z) *
            (dVar27 * dVar31 - dVar33 * dVar32) +
            (dVar30 - temp.mVerts.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar13].y) *
            (dVar29 * dVar33 - dVar34 * dVar31) +
            (dVar28 - temp.mVerts.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar13].x) *
            (dVar32 * dVar34 - dVar27 * dVar29) < 0.0) {
          dVar28 = paVar1[-4].z;
          dVar30 = paVar1[-4].x;
          dVar2 = paVar1[-4].y;
          paVar1[-4].z = paVar1[-1].z;
          dVar27 = paVar1[-1].y;
          paVar1[-4].x = paVar1[-1].x;
          paVar1[-4].y = dVar27;
          paVar1[-1].z = dVar28;
          paVar1[-1].x = dVar30;
          paVar1[-1].y = dVar2;
          rot.a3 = paVar1[-3].z;
          rot.a1 = paVar1[-3].x;
          rot.a2 = paVar1[-3].y;
          paVar1[-3].z = paVar1[-2].z;
          dVar28 = paVar1[-2].y;
          paVar1[-3].x = paVar1[-2].x;
          paVar1[-3].y = dVar28;
          paVar1[-2].z = rot.a3;
          paVar1[-2].x = rot.a1;
          paVar1[-2].y = rot.a2;
        }
        rot.a1 = (double)CONCAT44(rot.a1._4_4_,4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_110,(uint *)&rot);
        dVar26 = (double)((long)dVar26 + 0x18);
        uVar9 = (ulong)uVar11;
      }
      lVar8 = lVar8 + lVar5;
      local_1f8 = (double)((long)local_1f8 + lVar5);
      lVar13 = lVar13 + 1;
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4f990f);
  }
  std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
            (&points.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>);
  TempMesh::~TempMesh(&temp);
  return;
}

Assistant:

void ProcessSweptDiskSolid(const Schema_2x3::IfcSweptDiskSolid &solid, TempMesh& result, ConversionData& conv)
{
    const Curve* const curve = Curve::Convert(*solid.Directrix, conv);
    if(!curve) {
        IFCImporter::LogError("failed to convert Directrix curve (IfcSweptDiskSolid)");
        return;
    }

    const unsigned int cnt_segments = conv.settings.cylindricalTessellation;
    const IfcFloat deltaAngle = AI_MATH_TWO_PI/cnt_segments;

	TempMesh temp;
	curve->SampleDiscrete(temp, solid.StartParam, solid.EndParam);
	const std::vector<IfcVector3>& curve_points = temp.mVerts;

    const size_t samples = curve_points.size();

    result.mVerts.reserve(cnt_segments * samples * 4);
    result.mVertcnt.reserve((cnt_segments - 1) * samples);

    std::vector<IfcVector3> points;
    points.reserve(cnt_segments * samples);

    if(curve_points.empty()) {
        IFCImporter::LogWarn("curve evaluation yielded no points (IfcSweptDiskSolid)");
        return;
    }

    IfcVector3 current = curve_points[0];
    IfcVector3 previous = current;
    IfcVector3 next;

    IfcVector3 startvec;
    startvec.x = 1.0f;
    startvec.y = 1.0f;
    startvec.z = 1.0f;

    unsigned int last_dir = 0;

    // generate circles at the sweep positions
    for(size_t i = 0; i < samples; ++i) {

        if(i != samples - 1) {
            next = curve_points[i + 1];
        }

        // get a direction vector reflecting the approximate curvature (i.e. tangent)
        IfcVector3 d = (current-previous) + (next-previous);

        d.Normalize();

        // figure out an arbitrary point q so that (p-q) * d = 0,
        // try to maximize ||(p-q)|| * ||(p_last-q_last)||
        IfcVector3 q;
        bool take_any = false;

        for (unsigned int i = 0; i < 2; ++i, take_any = true) {
            if ((last_dir == 0 || take_any) && std::abs(d.x) > 1e-6) {
                q.y = startvec.y;
                q.z = startvec.z;
                q.x = -(d.y * q.y + d.z * q.z) / d.x;
                last_dir = 0;
                break;
            }
            else if ((last_dir == 1 || take_any) && std::abs(d.y) > 1e-6) {
                q.x = startvec.x;
                q.z = startvec.z;
                q.y = -(d.x * q.x + d.z * q.z) / d.y;
                last_dir = 1;
                break;
            }
            else if ((last_dir == 2 && std::abs(d.z) > 1e-6) || take_any) {
                q.y = startvec.y;
                q.x = startvec.x;
                q.z = -(d.y * q.y + d.x * q.x) / d.z;
                last_dir = 2;
                break;
            }
        }

        q *= solid.Radius / q.Length();
        startvec = q;

        // generate a rotation matrix to rotate q around d
        IfcMatrix4 rot;
        IfcMatrix4::Rotation(deltaAngle,d,rot);

        for (unsigned int seg = 0; seg < cnt_segments; ++seg, q *= rot ) {
            points.push_back(q + current);
        }

        previous = current;
        current = next;
    }

    // make quads
    for(size_t i = 0; i < samples - 1; ++i) {

        const aiVector3D& this_start = points[ i * cnt_segments ];

        // locate corresponding point on next sample ring
        unsigned int best_pair_offset = 0;
        float best_distance_squared = 1e10f;
        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {
            const aiVector3D& p = points[ (i+1) * cnt_segments + seg];
            const float l = (p-this_start).SquareLength();

            if(l < best_distance_squared) {
                best_pair_offset = seg;
                best_distance_squared = l;
            }
        }

        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {

            result.mVerts.push_back(points[ i * cnt_segments + (seg % cnt_segments)]);
            result.mVerts.push_back(points[ i * cnt_segments + (seg + 1) % cnt_segments]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + 1 + best_pair_offset) % cnt_segments)]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + best_pair_offset) % cnt_segments)]);

            IfcVector3& v1 = *(result.mVerts.end()-1);
            IfcVector3& v2 = *(result.mVerts.end()-2);
            IfcVector3& v3 = *(result.mVerts.end()-3);
            IfcVector3& v4 = *(result.mVerts.end()-4);

            if (((v4-v3) ^ (v4-v1)) * (v4 - curve_points[i]) < 0.0f) {
                std::swap(v4, v1);
                std::swap(v3, v2);
            }

            result.mVertcnt.push_back(4);
        }
    }

    IFCImporter::LogDebug("generate mesh procedurally by sweeping a disk along a curve (IfcSweptDiskSolid)");
}